

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3PendingTermsFlush(Fts3Table *p)

{
  uint uVar1;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  int i;
  int rc;
  sqlite3_stmt *pStmt;
  int in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint uVar2;
  int iVar3;
  Fts3Table *in_stack_fffffffffffffff0;
  sqlite3_value **apVal;
  
  apVal = *(sqlite3_value ***)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  uVar2 = 0;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffdc & 0xffffff;
    if (iVar3 == 0) {
      uVar1 = CONCAT13((int)uVar2 < *(int *)(in_RDI + 0x1ec),(int3)in_stack_ffffffffffffffdc);
    }
    in_stack_ffffffffffffffdc = uVar1;
    if ((char)(in_stack_ffffffffffffffdc >> 0x18) == '\0') break;
    iVar3 = fts3SegmentMerge(p,rc,i,unaff_retaddr_00);
    if (iVar3 == 0x65) {
      iVar3 = 0;
    }
    uVar2 = uVar2 + 1;
  }
  if ((((iVar3 == 0) && (*(char *)(in_RDI + 0x1cd) != '\0')) && (*(int *)(in_RDI + 0x60) == 0xff))
     && (*(int *)(in_RDI + 100) != 0)) {
    in_stack_fffffffffffffff0 = (Fts3Table *)0x0;
    iVar3 = fts3SqlStmt(p,rc,(sqlite3_stmt **)CONCAT44(unaff_retaddr_00,unaff_retaddr),apVal);
    if (iVar3 == 0) {
      sqlite3_bind_int((sqlite3_stmt *)(ulong)uVar2,in_stack_ffffffffffffffdc,
                       in_stack_ffffffffffffffd8);
      iVar3 = sqlite3_step((sqlite3_stmt *)CONCAT44(rc,i));
      if (iVar3 == 100) {
        iVar3 = sqlite3_column_int((sqlite3_stmt *)CONCAT44(100,uVar2),in_stack_ffffffffffffffdc);
        *(int *)(in_RDI + 0x60) = iVar3;
        if (*(int *)(in_RDI + 0x60) == 1) {
          *(undefined4 *)(in_RDI + 0x60) = 8;
        }
      }
      else if (iVar3 == 0x65) {
        *(undefined4 *)(in_RDI + 0x60) = 0;
      }
      iVar3 = sqlite3_reset((sqlite3_stmt *)in_stack_fffffffffffffff0);
    }
  }
  if (iVar3 == 0) {
    sqlite3Fts3PendingTermsClear(in_stack_fffffffffffffff0);
  }
  if (*(sqlite3_value ***)(in_FS_OFFSET + 0x28) != apVal) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3PendingTermsFlush(Fts3Table *p){
  int rc = SQLITE_OK;
  int i;

  for(i=0; rc==SQLITE_OK && i<p->nIndex; i++){
    rc = fts3SegmentMerge(p, p->iPrevLangid, i, FTS3_SEGCURSOR_PENDING);
    if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  }

  /* Determine the auto-incr-merge setting if unknown.  If enabled,
  ** estimate the number of leaf blocks of content to be written
  */
  if( rc==SQLITE_OK && p->bHasStat
   && p->nAutoincrmerge==0xff && p->nLeafAdd>0
  ){
    sqlite3_stmt *pStmt = 0;
    rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int(pStmt, 1, FTS_STAT_AUTOINCRMERGE);
      rc = sqlite3_step(pStmt);
      if( rc==SQLITE_ROW ){
        p->nAutoincrmerge = sqlite3_column_int(pStmt, 0);
        if( p->nAutoincrmerge==1 ) p->nAutoincrmerge = 8;
      }else if( rc==SQLITE_DONE ){
        p->nAutoincrmerge = 0;
      }
      rc = sqlite3_reset(pStmt);
    }
  }

  if( rc==SQLITE_OK ){
    sqlite3Fts3PendingTermsClear(p);
  }
  return rc;
}